

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  ushort uVar2;
  KeyInfo *pKVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  Mem *pMem2;
  bool bVar19;
  Mem mem1;
  uint local_9c;
  UnpackedRecord *local_98;
  u8 *local_90;
  double local_88;
  long local_78;
  uint local_6c;
  MemValue local_68;
  undefined2 local_60;
  u8 local_5e;
  uint local_5c;
  long local_58;
  sqlite3 *local_40;
  
  pMem2 = pPKey2->aMem;
  local_98 = pPKey2;
  if (bSkip == 0) {
    if (*pKey1 < 0) {
      bVar5 = sqlite3GetVarint32((uchar *)pKey1,&local_6c);
      uVar11 = (uint)bVar5;
    }
    else {
      uVar11 = 1;
      local_6c = (int)*pKey1;
    }
    uVar10 = 0;
    uVar13 = local_6c;
    goto LAB_00162d94;
  }
  if (*(char *)((long)pKey1 + 1) < '\0') {
    bVar5 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
    uVar11 = bVar5 + 1;
    bVar5 = *pKey1;
    uVar17 = local_68.nZero;
    if ((uint)local_68.nZero < 0x80) goto LAB_00162d79;
    local_6c = local_68.nZero - 0xcU >> 1;
  }
  else {
    bVar5 = *pKey1;
    uVar11 = 2;
    uVar17 = (int)*(char *)((long)pKey1 + 1);
LAB_00162d79:
    local_6c = (uint)""[(uint)uVar17];
  }
  local_6c = local_6c + bVar5;
  pMem2 = pMem2 + 1;
  uVar10 = 1;
  uVar13 = (uint)bVar5;
LAB_00162d94:
  if ((uint)nKey1 < local_6c) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13ac7,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    local_98->errCode = '\v';
    return 0;
  }
  local_90 = &local_98->errCode;
  uVar18 = local_6c;
  do {
    uVar9 = (ulong)uVar18;
    uVar2 = pMem2->flags;
    if ((uVar2 & 4) == 0) {
      if ((uVar2 & 8) == 0) {
        uVar12 = (ulong)uVar11;
        if ((uVar2 & 2) == 0) {
          bVar5 = *(byte *)((long)pKey1 + uVar12);
          uVar14 = (uint)bVar5;
          if ((uVar2 & 0x10) == 0) {
            uVar16 = (uint)(bVar5 != 0);
          }
          else {
            if ((char)bVar5 < '\0') {
              sqlite3GetVarint32((uchar *)(uVar12 + (long)pKey1),&local_9c);
              uVar14 = local_9c;
            }
            uVar15 = 0xffffffff;
            if ((uVar14 < 0xc) || ((uVar14 & 1) != 0)) goto LAB_00163269;
            uVar4 = uVar14 - 0xc >> 1;
            if ((uint)nKey1 < uVar4 + uVar18) {
              uVar8 = 0x13b30;
LAB_001632b9:
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar8,
                          "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
              *local_90 = '\v';
              return 0;
            }
            if ((pMem2->flags & 0x4000) == 0) {
              uVar15 = pMem2->n;
              uVar16 = uVar4 - uVar15;
              if ((int)uVar4 < (int)uVar15) {
                uVar15 = uVar4;
              }
LAB_001630c4:
              uVar15 = memcmp((void *)(uVar9 + (long)pKey1),pMem2->z,(long)(int)uVar15);
              if (uVar15 != 0) goto LAB_00163269;
            }
            else {
              if (uVar14 - 0xc != 0) {
                uVar12 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar12 + uVar9) != '\0') goto LAB_00163233;
                  uVar12 = uVar12 + 1;
                } while (uVar4 != uVar12);
              }
              uVar16 = uVar4 - (pMem2->u).nZero;
            }
          }
        }
        else {
          uVar14 = (int)*(char *)((long)pKey1 + uVar12);
          if (*(char *)((long)pKey1 + uVar12) < '\0') {
            sqlite3GetVarint32((uchar *)(uVar12 + (long)pKey1),&local_9c);
            uVar14 = local_9c;
          }
          if (uVar14 < 0xc) {
            uVar15 = 0xffffffff;
            goto LAB_00163269;
          }
          if ((uVar14 & 1) == 0) {
LAB_00163233:
            uVar15 = 1;
            goto LAB_00163269;
          }
          local_5c = uVar14 - 0xc >> 1;
          if (((uint)nKey1 < local_5c + uVar18) ||
             (pKVar3 = local_98->pKeyInfo, pKVar3->nAllField <= uVar10)) {
            uVar8 = 0x13b12;
            goto LAB_001632b9;
          }
          if (pKVar3->aColl[uVar10] == (CollSeq *)0x0) {
            uVar15 = pMem2->n;
            uVar16 = local_5c - uVar15;
            if ((int)local_5c < (int)uVar15) {
              uVar15 = local_5c;
            }
            goto LAB_001630c4;
          }
          local_5e = pKVar3->enc;
          local_40 = pKVar3->db;
          local_60 = 2;
          local_58 = uVar9 + (long)pKey1;
          uVar16 = vdbeCompareMemString((Mem *)&local_68,pMem2,pKVar3->aColl[uVar10],local_90);
        }
LAB_001630e2:
        uVar15 = uVar16;
        if (uVar15 != 0) goto LAB_00163269;
      }
      else {
        bVar5 = *(byte *)((long)pKey1 + (ulong)uVar11);
        uVar14 = (uint)bVar5;
        uVar15 = 1;
        if (9 < bVar5) goto LAB_00163269;
        uVar15 = 0xffffffff;
        if (bVar5 == 0) goto LAB_00163269;
        sqlite3VdbeSerialGet((uchar *)(uVar9 + (long)pKey1),(uint)bVar5,(Mem *)&local_68);
        dVar1 = (pMem2->u).r;
        if (bVar5 != 7) {
          if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) goto LAB_00163269;
          uVar16 = (uint)(dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero));
          local_88 = dVar1;
          goto LAB_001630e2;
        }
        if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < dVar1) goto LAB_00163269;
        uVar14 = 7;
        uVar15 = 1;
        if (dVar1 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_00163269;
      }
      goto LAB_00163185;
    }
    bVar5 = *(byte *)((long)pKey1 + (ulong)uVar11);
    uVar14 = (uint)bVar5;
    uVar15 = 1;
    if (9 < bVar5) goto LAB_00163269;
    if (bVar5 == 7) {
      uVar14 = 7;
      serialGet((uchar *)(uVar9 + (long)pKey1),7,(Mem *)&local_68);
      local_78 = (pMem2->u).i;
      uVar15 = 1;
      if ((double)local_78 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) goto LAB_00163269;
      uVar16 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_78);
      goto LAB_001630e2;
    }
    uVar15 = 0xffffffff;
    if (bVar5 == 0) goto LAB_00163269;
    switch(bVar5) {
    case 1:
      uVar12 = (ulong)*(char *)((long)pKey1 + uVar9);
      break;
    case 2:
      uVar7 = (long)*(char *)((long)pKey1 + uVar9) << 8;
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1);
      goto LAB_0016315d;
    case 3:
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 8 |
               (long)*(char *)((long)pKey1 + uVar9) << 0x10;
      bVar5 = *(byte *)((long)pKey1 + uVar9 + 2);
      goto LAB_0016314a;
    case 4:
      uVar12 = (ulong)*(byte *)((long)pKey1 + uVar9 + 2) << 8 |
               (long)(int)((uint)*(byte *)((long)pKey1 + uVar9) << 0x18) |
               (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 0x10;
      bVar5 = *(byte *)((long)pKey1 + uVar9 + 3);
LAB_0016314a:
      uVar12 = bVar5 | uVar12;
      break;
    case 5:
      uVar16 = *(uint *)((long)pKey1 + uVar9 + 2);
      uVar7 = (ulong)(uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                     uVar16 << 0x18);
      uVar12 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar9),
                                          *(undefined1 *)((long)pKey1 + uVar9 + 1)) << 0x20;
LAB_0016315d:
      uVar12 = uVar12 | uVar7;
      break;
    case 6:
      uVar9 = *(ulong *)((long)pKey1 + uVar9);
      uVar12 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18
               | (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 |
               (uVar9 & 0xff0000) << 0x18 | (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
      break;
    default:
      uVar12 = (ulong)(uVar14 - 8);
    }
    if (((long)uVar12 < (pMem2->u).i) || (uVar15 = 1, (pMem2->u).i < (long)uVar12)) {
LAB_00163269:
      if (local_98->pKeyInfo->aSortOrder[uVar10 & 0xffffffff] != '\0') {
        return -uVar15;
      }
      return uVar15;
    }
LAB_00163185:
    uVar10 = uVar10 + 1;
    if (uVar10 == local_98->nField) {
LAB_00163224:
      local_98->eqSeen = '\x01';
      return (int)local_98->default_rc;
    }
    if (uVar14 < 0x80) {
      uVar15 = (uint)""[uVar14];
      iVar6 = 1;
    }
    else {
      uVar15 = uVar14 - 0xc >> 1;
      iVar6 = 1;
      uVar9 = (ulong)uVar14;
      do {
        iVar6 = iVar6 + 1;
        bVar19 = 0x3fff < uVar9;
        uVar9 = uVar9 >> 7;
      } while (bVar19);
    }
    uVar18 = uVar18 + uVar15;
    uVar11 = uVar11 + iVar6;
    if ((uVar13 <= uVar11) || (pMem2 = pMem2 + 1, (uint)nKey1 < uVar18)) goto LAB_00163224;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1;
    idx1 = 1 + getVarint32(&aKey1[1], s1);
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    idx1 = getVarint32(aKey1, szHdr1);
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){ 
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField 
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortOrder!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & MEM_Int ){
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future 
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n; 
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      if( pPKey2->pKeyInfo->aSortOrder[i] ){
        rc = -rc;
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB 
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc) 
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}